

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient3dexact(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dStack_c70;
  double local_bb8 [4];
  double local_b98 [4];
  undefined1 local_b78 [16];
  double local_b68;
  double local_b60;
  double local_b58;
  double dStack_b50;
  double local_b48;
  double local_b40;
  double local_b38;
  double dStack_b30;
  double local_b28;
  double local_b20;
  double temp8 [8];
  double local_ad8;
  double dStack_ad0;
  double local_ac8;
  double local_ac0;
  double dab [12];
  double cda [12];
  double abc [12];
  double cdet [24];
  double bdet [24];
  double adet [24];
  double bcd [12];
  double ddet [24];
  double deter [96];
  double cddet [48];
  double abdet [48];
  
  dVar28 = *pb;
  dVar29 = pb[1];
  dVar13 = *pa;
  dVar18 = pa[1];
  dVar19 = dVar29 * dVar13;
  dVar7 = dVar28 * dVar18;
  dVar8 = splitter * dVar29 - (splitter * dVar29 - dVar29);
  dVar14 = splitter * dVar28 - (splitter * dVar28 - dVar28);
  dVar21 = dVar29 - dVar8;
  dVar24 = dVar28 - dVar14;
  dVar9 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar15 = splitter * dVar18 - (splitter * dVar18 - dVar18);
  dVar39 = dVar13 - dVar9;
  dVar40 = dVar18 - dVar15;
  dVar22 = dVar21 * dVar39 - (((dVar19 - dVar9 * dVar8) - dVar39 * dVar8) - dVar21 * dVar9);
  dVar25 = dVar24 * dVar40 - (((dVar7 - dVar14 * dVar15) - dVar24 * dVar15) - dVar40 * dVar14);
  dVar27 = dVar22 - dVar25;
  dVar10 = dVar19 + dVar27;
  dVar19 = (dVar19 - (dVar10 - (dVar10 - dVar19))) + (dVar27 - (dVar10 - dVar19));
  dVar20 = dVar19 - dVar7;
  dVar9 = -dVar9;
  dVar14 = -dVar14;
  local_b38 = (dVar22 - (dVar27 + (dVar22 - dVar27))) + ((dVar22 - dVar27) - dVar25);
  dStack_b30 = (dVar19 - (dVar20 + (dVar19 - dVar20))) + ((dVar19 - dVar20) - dVar7);
  local_b20 = dVar10 + dVar20;
  local_b28 = (dVar10 - (local_b20 - (local_b20 - dVar10))) + (dVar20 - (local_b20 - dVar10));
  dVar10 = *pc;
  dVar20 = pc[1];
  dVar11 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar16 = splitter * dVar20 - (splitter * dVar20 - dVar20);
  dVar22 = *pd;
  dVar25 = pd[1];
  dVar31 = splitter * dVar25 - (splitter * dVar25 - dVar25);
  dVar32 = splitter * dVar22 - (splitter * dVar22 - dVar22);
  dVar12 = -dVar11;
  dVar17 = -dVar32;
  dVar33 = dVar10 - dVar11;
  dVar34 = dVar20 - dVar16;
  dVar38 = -dVar24;
  dVar23 = dVar25 - dVar31;
  dVar26 = dVar22 - dVar32;
  auVar1._8_4_ = SUB84(dVar26,0);
  auVar1._0_8_ = dVar38;
  auVar1._12_4_ = (int)((ulong)-dVar26 >> 0x20);
  dVar19 = dVar29 * dVar10;
  dVar7 = dVar28 * dVar20;
  dVar36 = dVar21 * dVar33 - (dVar12 * dVar21 + -dVar33 * dVar8 + dVar12 * dVar8 + dVar19);
  dVar37 = dVar24 * dVar34 - (dVar34 * dVar14 + dVar16 * dVar38 + dVar16 * dVar14 + dVar7);
  dVar35 = dVar37 - dVar36;
  dVar30 = dVar7 + dVar35;
  dVar7 = (dVar7 - (dVar30 - (dVar30 - dVar7))) + (dVar35 - (dVar30 - dVar7));
  dVar27 = dVar7 - dVar19;
  dVar19 = (dVar7 - ((dVar7 - dVar27) + dVar27)) + ((dVar7 - dVar27) - dVar19);
  local_b78._8_4_ = SUB84(dVar19,0);
  local_b78._0_8_ = (dVar37 - (dVar35 + (dVar37 - dVar35))) + ((dVar37 - dVar35) - dVar36);
  local_b78._12_4_ = (int)((ulong)dVar19 >> 0x20);
  local_b60 = dVar30 + dVar27;
  local_b68 = (dVar30 - (local_b60 - (local_b60 - dVar30))) + (dVar27 - (local_b60 - dVar30));
  dVar7 = dVar10 * dVar25;
  dVar27 = dVar20 * dVar22;
  dVar35 = dVar33 * dVar23 - (((dVar7 - dVar11 * dVar31) - dVar31 * dVar33) - dVar23 * dVar11);
  dVar32 = dVar34 * dVar26 - (((dVar27 - dVar32 * dVar16) - dVar16 * dVar26) - dVar34 * dVar32);
  dVar11 = dVar35 - dVar32;
  dVar19 = dVar7 + dVar11;
  dVar7 = (dVar7 - (dVar19 - (dVar19 - dVar7))) + (dVar11 - (dVar19 - dVar7));
  dVar30 = dVar7 - dVar27;
  local_b58 = (dVar35 - (dVar11 + (dVar35 - dVar11))) + ((dVar35 - dVar11) - dVar32);
  dStack_b50 = (dVar7 - (dVar30 + (dVar7 - dVar30))) + ((dVar7 - dVar30) - dVar27);
  local_b40 = dVar19 + dVar30;
  local_b48 = (dVar19 - (local_b40 - (local_b40 - dVar19))) + (dVar30 - (local_b40 - dVar19));
  dVar20 = dVar20 * dVar13;
  dVar10 = dVar10 * dVar18;
  dVar13 = dVar13 * dVar25;
  dVar18 = dVar18 * dVar22;
  dVar30 = dVar39 * dVar23 - (dVar23 * dVar9 + -dVar39 * dVar31 + dVar9 * dVar31 + dVar13);
  dVar32 = dVar40 * dVar26 - (dVar40 * dVar17 + -dVar26 * dVar15 + dVar17 * dVar15 + dVar18);
  dVar11 = dVar32 - dVar30;
  dVar27 = dVar18 + dVar11;
  dVar19 = (dVar18 - (dVar27 - (dVar27 - dVar18))) + (dVar11 - (dVar27 - dVar18));
  dVar7 = dVar19 - dVar13;
  local_ad8 = (dVar32 - (dVar11 + (dVar32 - dVar11))) + ((dVar32 - dVar11) - dVar30);
  dStack_ad0 = (dVar19 - ((dVar19 - dVar7) + dVar7)) + ((dVar19 - dVar7) - dVar13);
  local_ac0 = dVar27 + dVar7;
  local_ac8 = (dVar27 - (local_ac0 - (local_ac0 - dVar27))) + (dVar7 - (local_ac0 - dVar27));
  dVar19 = dVar34 * dVar39 - (dVar34 * dVar9 + -dVar39 * dVar16 + dVar9 * dVar16 + dVar20);
  dVar9 = dVar33 * dVar40 - (dVar40 * dVar12 + -dVar33 * dVar15 + dVar12 * dVar15 + dVar10);
  dVar13 = dVar19 - dVar9;
  dVar7 = dVar20 + dVar13;
  dVar18 = (dVar20 - (dVar7 - (dVar7 - dVar20))) + (dVar13 - (dVar7 - dVar20));
  dVar20 = dVar18 - dVar10;
  local_b98[0] = (dVar19 - (dVar13 + (dVar19 - dVar13))) + ((dVar19 - dVar13) - dVar9);
  local_b98[1] = (dVar18 - (dVar20 + (dVar18 - dVar20))) + ((dVar18 - dVar20) - dVar10);
  local_b98[3] = dVar7 + dVar20;
  local_b98[2] = (dVar7 - (local_b98[3] - (local_b98[3] - dVar7))) +
                 (dVar20 - (local_b98[3] - dVar7));
  dVar25 = dVar25 * dVar28;
  dVar22 = dVar22 * dVar29;
  dStack_c70 = auVar1._8_8_;
  dVar28 = dVar24 * dVar23 - (dVar23 * dVar14 + dVar38 * dVar31 + dVar14 * dVar31 + dVar25);
  dVar29 = dVar21 * dVar26 - (dVar21 * dVar17 + dStack_c70 * dVar8 + dVar17 * dVar8 + dVar22);
  dVar14 = dVar28 - dVar29;
  dVar19 = dVar25 + dVar14;
  dVar9 = (dVar25 - (dVar19 - (dVar19 - dVar25))) + (dVar14 - (dVar19 - dVar25));
  dVar7 = dVar9 - dVar22;
  local_bb8[0] = (dVar28 - (dVar14 + (dVar28 - dVar14))) + ((dVar28 - dVar14) - dVar29);
  local_bb8[1] = (dVar9 - (dVar7 + (dVar9 - dVar7))) + ((dVar9 - dVar7) - dVar22);
  local_bb8[3] = dVar19 + dVar7;
  local_bb8[2] = (dVar19 - (local_bb8[3] - (local_bb8[3] - dVar19))) +
                 (dVar7 - (local_bb8[3] - dVar19));
  iVar2 = fast_expansion_sum_zeroelim(4,&local_b58,4,&local_ad8,temp8);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp8,4,local_b98,cda);
  iVar3 = fast_expansion_sum_zeroelim(4,&local_ad8,4,&local_b38,temp8);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,temp8,4,local_bb8,dab);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    local_bb8[lVar6] = -local_bb8[lVar6];
    local_b98[lVar6] = -local_b98[lVar6];
  }
  iVar4 = fast_expansion_sum_zeroelim(4,&local_b38,4,(double *)local_b78,temp8);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,temp8,4,local_b98,abc);
  iVar5 = fast_expansion_sum_zeroelim(4,(double *)local_b78,4,&local_b58,temp8);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,temp8,4,local_bb8,bcd);
  iVar5 = scale_expansion_zeroelim(iVar5,bcd,pa[2],adet);
  iVar2 = scale_expansion_zeroelim(iVar2,cda,-pb[2],bdet);
  iVar3 = scale_expansion_zeroelim(iVar3,dab,pc[2],cdet);
  iVar4 = scale_expansion_zeroelim(iVar4,abc,-pd[2],ddet);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,adet,iVar2,bdet,abdet);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,cdet,iVar4,ddet,cddet);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,abdet,iVar3,cddet,deter);
  return ddet[(long)iVar2 + 0x17];
}

Assistant:

REAL orient3dexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL adet[24], bdet[24], cdet[24], ddet[24];
  int alen, blen, clen, dlen;
  REAL abdet[48], cddet[48];
  int ablen, cdlen;
  REAL deter[96];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  alen = scale_expansion_zeroelim(bcdlen, bcd, pa[2], adet);
  blen = scale_expansion_zeroelim(cdalen, cda, -pb[2], bdet);
  clen = scale_expansion_zeroelim(dablen, dab, pc[2], cdet);
  dlen = scale_expansion_zeroelim(abclen, abc, -pd[2], ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}